

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

uint HuffmanTree_makeFromLengths2(HuffmanTree *tree)

{
  uint uVar1;
  uint uVar2;
  uint *puVar3;
  uint uVar4;
  uint *puVar5;
  ulong uVar6;
  ulong uVar7;
  uint value;
  uint value_00;
  int iVar8;
  int iVar9;
  uint uVar10;
  uivector nextcode;
  uivector blcount;
  
  nextcode.allocsize = 0;
  blcount.data = (uint *)0x0;
  blcount.size = 0;
  blcount.allocsize = 0;
  nextcode.data = (uint *)0x0;
  nextcode.size = 0;
  puVar5 = (uint *)malloc((ulong)tree->numcodes << 2);
  tree->tree1d = puVar5;
  uVar4 = uivector_resizev(&blcount,(ulong)(tree->maxbitlen + 1),value);
  if (((uVar4 == 0) ||
      (uVar4 = uivector_resizev(&nextcode,(ulong)(tree->maxbitlen + 1),value_00),
      puVar5 == (uint *)0x0)) || (uVar4 == 0)) {
    uivector_cleanup(&blcount);
    uivector_cleanup(&nextcode);
  }
  else {
    for (uVar4 = 0; uVar4 != tree->numcodes; uVar4 = uVar4 + 1) {
      blcount.data[tree->lengths[uVar4]] = blcount.data[tree->lengths[uVar4]] + 1;
    }
    uVar6 = 0;
    while (uVar4 = (int)uVar6 + 1, uVar4 <= tree->maxbitlen) {
      nextcode.data[uVar4] = (blcount.data[uVar6] + nextcode.data[uVar6]) * 2;
      uVar6 = (ulong)uVar4;
    }
    for (uVar6 = 0; (uint)uVar6 != tree->numcodes; uVar6 = (ulong)((uint)uVar6 + 1)) {
      uVar7 = (ulong)tree->lengths[uVar6];
      if (uVar7 != 0) {
        uVar4 = nextcode.data[uVar7];
        nextcode.data[uVar7] = uVar4 + 1;
        tree->tree1d[uVar6] = uVar4;
      }
    }
    uivector_cleanup(&blcount);
    uivector_cleanup(&nextcode);
    uVar4 = tree->numcodes;
    uVar6 = (ulong)(uVar4 * 2);
    puVar5 = (uint *)malloc(uVar6 * 4);
    tree->tree2d = puVar5;
    if (puVar5 != (uint *)0x0) {
      for (uVar7 = 0; uVar6 != uVar7; uVar7 = uVar7 + 1) {
        puVar5[uVar7] = 0x7fff;
      }
      uVar7 = 0;
      iVar8 = 0;
      iVar9 = 0;
      do {
        if (uVar7 == uVar4) {
          for (uVar7 = 0; uVar6 != uVar7; uVar7 = uVar7 + 1) {
            if (puVar5[uVar7] == 0x7fff) {
              puVar5[uVar7] = 0;
            }
          }
          return 0;
        }
        puVar3 = tree->lengths;
        uVar10 = 0;
        while (uVar2 = puVar3[uVar7], uVar10 != uVar2) {
          if (iVar9 < 0) {
            return 0x37;
          }
          if (uVar4 < iVar9 + 2U) {
            return 0x37;
          }
          uVar1 = (tree->tree1d[uVar7] >> (~uVar10 + uVar2 & 0x1f) & 1) + iVar9 * 2;
          if (puVar5[uVar1] == 0x7fff) {
            uVar10 = uVar10 + 1;
            if (uVar10 == uVar2) {
              puVar5[uVar1] = (uint)uVar7;
              iVar9 = 0;
              uVar10 = uVar2;
            }
            else {
              iVar9 = iVar8 + 1;
              puVar5[uVar1] = iVar8 + 1 + uVar4;
              iVar8 = iVar9;
            }
          }
          else {
            iVar9 = puVar5[uVar1] - uVar4;
            uVar10 = uVar10 + 1;
          }
        }
        uVar7 = uVar7 + 1;
      } while( true );
    }
  }
  return 0x53;
}

Assistant:

static unsigned HuffmanTree_makeFromLengths2(HuffmanTree* tree)
{
  uivector blcount;
  uivector nextcode;
  unsigned error = 0;
  unsigned bits, n;

  uivector_init(&blcount);
  uivector_init(&nextcode);

  tree->tree1d = (unsigned*)lodepng_malloc(tree->numcodes * sizeof(unsigned));
  if(!tree->tree1d) error = 83; /*alloc fail*/

  if(!uivector_resizev(&blcount, tree->maxbitlen + 1, 0)
  || !uivector_resizev(&nextcode, tree->maxbitlen + 1, 0))
    error = 83; /*alloc fail*/

  if(!error)
  {
    /*step 1: count number of instances of each code length*/
    for(bits = 0; bits != tree->numcodes; ++bits) ++blcount.data[tree->lengths[bits]];
    /*step 2: generate the nextcode values*/
    for(bits = 1; bits <= tree->maxbitlen; ++bits)
    {
      nextcode.data[bits] = (nextcode.data[bits - 1] + blcount.data[bits - 1]) << 1;
    }
    /*step 3: generate all the codes*/
    for(n = 0; n != tree->numcodes; ++n)
    {
      if(tree->lengths[n] != 0) tree->tree1d[n] = nextcode.data[tree->lengths[n]]++;
    }
  }

  uivector_cleanup(&blcount);
  uivector_cleanup(&nextcode);

  if(!error) return HuffmanTree_make2DTree(tree);
  else return error;
}